

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O1

bool cmStrToULong(char *str,unsigned_long *value)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  char cVar5;
  bool bVar6;
  char *endp;
  char *local_30;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  cVar5 = *str;
  if (-1 < cVar5) {
    iVar2 = isspace((int)cVar5);
    if (iVar2 != 0) {
      pcVar1 = str + 1;
      do {
        str = pcVar1;
        cVar5 = *str;
        if (cVar5 < '\0') break;
        iVar2 = isspace((int)cVar5);
        pcVar1 = str + 1;
      } while (iVar2 != 0);
    }
  }
  if (cVar5 == '-') {
    bVar6 = false;
  }
  else {
    uVar4 = strtoul(str,&local_30,10);
    *value = uVar4;
    bVar6 = false;
    if ((local_30 != str) && (*local_30 == '\0')) {
      bVar6 = *piVar3 == 0;
    }
  }
  return bVar6;
}

Assistant:

bool cmStrToULong(const char* str, unsigned long* value)
{
  errno = 0;
  char* endp;
  while (cmIsSpace(*str)) {
    ++str;
  }
  if (*str == '-') {
    return false;
  }
  *value = strtoul(str, &endp, 10);
  return (*endp == '\0') && (endp != str) && (errno == 0);
}